

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall google::protobuf::Descriptor::CopyTo(Descriptor *this,DescriptorProto *proto)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined8 uVar4;
  ulong uVar5;
  long lVar6;
  Rep *pRVar7;
  OneofDescriptorProto *pOVar8;
  DescriptorProto *pDVar9;
  EnumDescriptorProto *pEVar10;
  DescriptorProto_ExtensionRange *pDVar11;
  FieldDescriptorProto *pFVar12;
  DescriptorProto_ReservedRange *obj;
  void *pvVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *obj_00;
  string *psVar14;
  MessageOptions *this_00;
  undefined8 *puVar15;
  long lVar16;
  MessageOptions *from;
  Arena *arena;
  long lVar17;
  
  uVar4 = *(undefined8 *)(this + 8);
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  uVar5 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar15 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar15 = (undefined8 *)*puVar15;
  }
  internal::ArenaStringPtr::Set(&proto->name_,uVar4,puVar15);
  if (0 < *(int *)(this + 4)) {
    lVar17 = 0;
    lVar16 = 0;
    do {
      lVar6 = *(long *)(this + 0x28);
      pRVar7 = (proto->field_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
LAB_00348a54:
        pFVar12 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>
                            ((proto->field_).super_RepeatedPtrFieldBase.arena_);
        pFVar12 = (FieldDescriptorProto *)
                  internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(proto->field_).super_RepeatedPtrFieldBase,pFVar12);
      }
      else {
        iVar1 = (proto->field_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar7->allocated_size <= iVar1) goto LAB_00348a54;
        (proto->field_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pFVar12 = (FieldDescriptorProto *)pRVar7->elements[iVar1];
      }
      FieldDescriptor::CopyTo((FieldDescriptor *)(lVar6 + lVar17),pFVar12);
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0x48;
    } while (lVar16 < *(int *)(this + 4));
  }
  if (0 < *(int *)(this + 0x68)) {
    lVar17 = 0;
    lVar16 = 0;
    do {
      lVar6 = *(long *)(this + 0x30);
      pRVar7 = (proto->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
LAB_00348ac3:
        pOVar8 = Arena::CreateMaybeMessage<google::protobuf::OneofDescriptorProto>
                           ((proto->oneof_decl_).super_RepeatedPtrFieldBase.arena_);
        pOVar8 = (OneofDescriptorProto *)
                 internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                           (&(proto->oneof_decl_).super_RepeatedPtrFieldBase,pOVar8);
      }
      else {
        iVar1 = (proto->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar7->allocated_size <= iVar1) goto LAB_00348ac3;
        (proto->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pOVar8 = (OneofDescriptorProto *)pRVar7->elements[iVar1];
      }
      OneofDescriptor::CopyTo((OneofDescriptor *)(lVar6 + lVar17),pOVar8);
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0x28;
    } while (lVar16 < *(int *)(this + 0x68));
  }
  if (0 < *(int *)(this + 0x70)) {
    lVar17 = 0;
    lVar16 = 0;
    do {
      lVar6 = *(long *)(this + 0x38);
      pRVar7 = (proto->nested_type_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
LAB_00348b26:
        pDVar9 = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto>
                           ((proto->nested_type_).super_RepeatedPtrFieldBase.arena_);
        pDVar9 = (DescriptorProto *)
                 internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                           (&(proto->nested_type_).super_RepeatedPtrFieldBase,pDVar9);
      }
      else {
        iVar1 = (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar7->allocated_size <= iVar1) goto LAB_00348b26;
        (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pDVar9 = (DescriptorProto *)pRVar7->elements[iVar1];
      }
      CopyTo((Descriptor *)(lVar6 + lVar17),pDVar9);
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0x88;
    } while (lVar16 < *(int *)(this + 0x70));
  }
  if (0 < *(int *)(this + 0x74)) {
    lVar17 = 0;
    lVar16 = 0;
    do {
      lVar6 = *(long *)(this + 0x40);
      pRVar7 = (proto->enum_type_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
LAB_00348b8c:
        pEVar10 = Arena::CreateMaybeMessage<google::protobuf::EnumDescriptorProto>
                            ((proto->enum_type_).super_RepeatedPtrFieldBase.arena_);
        pEVar10 = (EnumDescriptorProto *)
                  internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(proto->enum_type_).super_RepeatedPtrFieldBase,pEVar10);
      }
      else {
        iVar1 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar7->allocated_size <= iVar1) goto LAB_00348b8c;
        (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pEVar10 = (EnumDescriptorProto *)pRVar7->elements[iVar1];
      }
      EnumDescriptor::CopyTo((EnumDescriptor *)(lVar6 + lVar17),pEVar10);
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0x48;
    } while (lVar16 < *(int *)(this + 0x74));
  }
  if (0 < *(int *)(this + 0x78)) {
    lVar17 = 0;
    lVar16 = 0;
    do {
      lVar6 = *(long *)(this + 0x48);
      pRVar7 = (proto->extension_range_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
LAB_00348bef:
        pDVar11 = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ExtensionRange>
                            ((proto->extension_range_).super_RepeatedPtrFieldBase.arena_);
        pDVar11 = (DescriptorProto_ExtensionRange *)
                  internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(proto->extension_range_).super_RepeatedPtrFieldBase,pDVar11);
      }
      else {
        iVar1 = (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar7->allocated_size <= iVar1) goto LAB_00348bef;
        (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pDVar11 = (DescriptorProto_ExtensionRange *)pRVar7->elements[iVar1];
      }
      ExtensionRange::CopyTo((ExtensionRange *)(lVar6 + lVar17),pDVar11);
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0x10;
    } while (lVar16 < *(int *)(this + 0x78));
  }
  if (0 < *(int *)(this + 0x7c)) {
    lVar17 = 0;
    lVar16 = 0;
    do {
      lVar6 = *(long *)(this + 0x50);
      pRVar7 = (proto->extension_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
LAB_00348c5b:
        pFVar12 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>
                            ((proto->extension_).super_RepeatedPtrFieldBase.arena_);
        pFVar12 = (FieldDescriptorProto *)
                  internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(proto->extension_).super_RepeatedPtrFieldBase,pFVar12);
      }
      else {
        iVar1 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar7->allocated_size <= iVar1) goto LAB_00348c5b;
        (proto->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pFVar12 = (FieldDescriptorProto *)pRVar7->elements[iVar1];
      }
      FieldDescriptor::CopyTo((FieldDescriptor *)(lVar6 + lVar17),pFVar12);
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0x48;
    } while (lVar16 < *(int *)(this + 0x7c));
  }
  if (0 < *(int *)(this + 0x80)) {
    lVar16 = 0;
    do {
      pRVar7 = (proto->reserved_range_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
LAB_00348cc4:
        obj = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ReservedRange>
                        ((proto->reserved_range_).super_RepeatedPtrFieldBase.arena_);
        pvVar13 = internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(proto->reserved_range_).super_RepeatedPtrFieldBase,obj);
      }
      else {
        iVar1 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar7->allocated_size <= iVar1) goto LAB_00348cc4;
        (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pvVar13 = pRVar7->elements[iVar1];
      }
      lVar17 = *(long *)(this + 0x58);
      uVar2 = *(undefined4 *)(lVar17 + lVar16 * 8);
      uVar3 = *(uint *)((long)pvVar13 + 0x10);
      *(uint *)((long)pvVar13 + 0x10) = uVar3 | 1;
      *(undefined4 *)((long)pvVar13 + 0x18) = uVar2;
      uVar2 = *(undefined4 *)(lVar17 + 4 + lVar16 * 8);
      *(uint *)((long)pvVar13 + 0x10) = uVar3 | 3;
      *(undefined4 *)((long)pvVar13 + 0x1c) = uVar2;
      lVar16 = lVar16 + 1;
    } while (lVar16 < *(int *)(this + 0x80));
  }
  if (0 < *(int *)(this + 0x84)) {
    lVar16 = 0;
    do {
      pRVar7 = (proto->reserved_name_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
LAB_00348d4d:
        obj_00 = Arena::Create<std::__cxx11::string>
                           ((proto->reserved_name_).super_RepeatedPtrFieldBase.arena_);
        psVar14 = (string *)
                  internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(proto->reserved_name_).super_RepeatedPtrFieldBase,obj_00);
      }
      else {
        iVar1 = (proto->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar7->allocated_size <= iVar1) goto LAB_00348d4d;
        (proto->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        psVar14 = (string *)pRVar7->elements[iVar1];
      }
      std::__cxx11::string::_M_assign(psVar14);
      lVar16 = lVar16 + 1;
    } while (lVar16 < *(int *)(this + 0x84));
  }
  from = *(MessageOptions **)(this + 0x20);
  if (from != (MessageOptions *)_MessageOptions_default_instance_) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    this_00 = proto->options_;
    if (this_00 == (MessageOptions *)0x0) {
      uVar5 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      arena = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        arena = *(Arena **)arena;
      }
      this_00 = Arena::CreateMaybeMessage<google::protobuf::MessageOptions>(arena);
      proto->options_ = this_00;
      from = *(MessageOptions **)(this + 0x20);
    }
    MessageOptions::CopyFrom(this_00,from);
    return;
  }
  return;
}

Assistant:

void Descriptor::CopyTo(DescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < field_count(); i++) {
    field(i)->CopyTo(proto->add_field());
  }
  for (int i = 0; i < oneof_decl_count(); i++) {
    oneof_decl(i)->CopyTo(proto->add_oneof_decl());
  }
  for (int i = 0; i < nested_type_count(); i++) {
    nested_type(i)->CopyTo(proto->add_nested_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < extension_range_count(); i++) {
    extension_range(i)->CopyTo(proto->add_extension_range());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }
  for (int i = 0; i < reserved_range_count(); i++) {
    DescriptorProto::ReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (&options() != &MessageOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}